

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

size_t Imf_2_5::bytesPerDeepLineTable
                 (Header *header,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  size_t sVar1;
  int in_stack_00000038;
  int in_stack_0000003c;
  Header *in_stack_00000040;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000050;
  
  Header::dataWindow((Header *)0x17c3ff);
  Header::dataWindow((Header *)0x17c410);
  sVar1 = bytesPerDeepLineTable
                    (in_stack_00000040,in_stack_0000003c,in_stack_00000038,(char *)header,base._4_4_
                     ,(int)base,in_stack_00000050);
  return sVar1;
}

Assistant:

size_t
bytesPerDeepLineTable (const Header &header,
                       char* base,
                       int xStride,
                       int yStride,
                       vector<size_t> &bytesPerLine)
{
    return bytesPerDeepLineTable(header,
                                 header.dataWindow().min.y,
                                 header.dataWindow().max.y,
                                 base,
                                 xStride,
                                 yStride,
                                 bytesPerLine);
}